

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first_last_any.cpp
# Opt level: O2

void duckdb::FirstFunction<false,true>::
     Operation<duckdb::hugeint_t,duckdb::FirstState<duckdb::hugeint_t>,duckdb::FirstFunction<false,true>>
               (FirstState<duckdb::hugeint_t> *state,hugeint_t *input,
               AggregateUnaryInput *unary_input)

{
  int64_t iVar1;
  bool bVar2;
  
  if (state->is_set == false) {
    bVar2 = AggregateUnaryInput::RowIsValid(unary_input);
    if (bVar2) {
      state->is_set = true;
      state->is_null = false;
      iVar1 = input->upper;
      (state->value).lower = input->lower;
      (state->value).upper = iVar1;
    }
    else {
      state->is_null = true;
    }
  }
  return;
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input) {
		if (LAST || !state.is_set) {
			if (!unary_input.RowIsValid()) {
				if (!SKIP_NULLS) {
					state.is_set = true;
				}
				state.is_null = true;
			} else {
				state.is_set = true;
				state.is_null = false;
				state.value = input;
			}
		}
	}